

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  undefined4 uVar4;
  uchar *puVar5;
  ImFont *pIVar6;
  uchar *puVar7;
  byte *pbVar8;
  uint uVar9;
  byte *pbVar10;
  ulong uVar11;
  int iVar12;
  undefined8 unaff_R15;
  ImFontConfig font_cfg;
  ImFontConfig local_148;
  ImFontConfig local_b8;
  
  iVar12 = swap_bytes(*(undefined4 *)((long)compressed_ttf_data + 8));
  puVar5 = (uchar *)ImGui::MemAlloc(CONCAT44((int)((ulong)unaff_R15 >> 0x20),iVar12));
  iVar3 = swap_bytes(*compressed_ttf_data);
  if ((iVar3 == 0x57bc0000) &&
     (iVar3 = swap_bytes(*(undefined4 *)((long)compressed_ttf_data + 4)), iVar3 == 0)) {
    uVar4 = swap_bytes(*(undefined4 *)((long)compressed_ttf_data + 8));
    pbVar10 = (byte *)((long)compressed_ttf_data + 0x10);
    stb__barrier_in_b = (uchar *)compressed_ttf_data;
    stb__barrier_out_e = puVar5 + CONCAT44((int)((ulong)puVar5 >> 0x20),uVar4);
    stb__barrier_out_b = puVar5;
    stb__dout = puVar5;
    do {
      bVar1 = *pbVar10;
      uVar9 = (uint)bVar1;
      if (bVar1 < 0x20) {
        if (bVar1 < 0x18) {
          if (bVar1 < 0x10) {
            if (bVar1 < 8) {
              if (bVar1 == 4) {
                uVar2 = swap_bytes(*(undefined2 *)(pbVar10 + 4));
                stb__match(stb__dout +
                           ~((ulong)pbVar10[3] | (ulong)pbVar10[1] << 0x10 | (ulong)pbVar10[2] << 8)
                           ,uVar2 + 1);
                pbVar8 = pbVar10 + 6;
              }
              else {
                if (uVar9 == 6) {
                  uVar11 = ~((ulong)pbVar10[3] | (ulong)pbVar10[1] << 0x10 | (ulong)pbVar10[2] << 8)
                  ;
                  uVar9 = (uint)pbVar10[4];
                  goto LAB_0024714a;
                }
                pbVar8 = pbVar10;
                if (uVar9 == 7) {
                  uVar2 = swap_bytes(*(undefined2 *)(pbVar10 + 1));
                  puVar7 = stb__dout + (ulong)uVar2 + 1;
                  if (puVar7 <= stb__barrier_out_e) {
                    if (pbVar10 + 3 < stb__barrier_in_b) {
                      puVar7 = stb__barrier_out_e + 1;
                    }
                    else {
                      memcpy(stb__dout,pbVar10 + 3,(ulong)uVar2 + 1);
                    }
                  }
                  uVar2 = swap_bytes(*(undefined2 *)(pbVar10 + 1));
                  pbVar8 = pbVar10 + (ulong)uVar2 + 4;
                  stb__dout = puVar7;
                }
              }
            }
            else {
              uVar11 = (ulong)((uint)bVar1 * 0x100 + -0x7ff + (uint)pbVar10[1]);
              puVar7 = stb__dout + uVar11;
              if (puVar7 <= stb__barrier_out_e) {
                if (pbVar10 + 2 < stb__barrier_in_b) {
                  puVar7 = stb__barrier_out_e + 1;
                }
                else {
                  memcpy(stb__dout,pbVar10 + 2,uVar11);
                }
              }
              uVar2 = swap_bytes(*(undefined2 *)pbVar10);
              pbVar8 = pbVar10 + ((ulong)uVar2 - 0x7fd);
              stb__dout = puVar7;
            }
          }
          else {
            uVar11 = -(ulong)((uint)pbVar10[1] * 0x100 + -0xfffff +
                             ((uint)pbVar10[2] | (uint)bVar1 << 0x10));
            uVar2 = swap_bytes(*(undefined2 *)(pbVar10 + 3));
            uVar9 = (uint)uVar2;
LAB_0024714a:
            stb__match(stb__dout + uVar11,uVar9 + 1);
            pbVar8 = pbVar10 + 5;
          }
        }
        else {
          stb__match(stb__dout +
                     -(ulong)((uint)pbVar10[1] * 0x100 + -0x17ffff +
                             ((uint)pbVar10[2] | (uint)bVar1 << 0x10)),pbVar10[3] + 1);
          pbVar8 = pbVar10 + 4;
        }
      }
      else if ((char)bVar1 < '\0') {
        stb__match(stb__dout + ~(ulong)pbVar10[1],uVar9 - 0x7f);
        pbVar8 = pbVar10 + 2;
      }
      else if (bVar1 < 0x40) {
        puVar7 = stb__dout + (uVar9 - 0x1f);
        if (puVar7 <= stb__barrier_out_e) {
          if (pbVar10 + 1 < stb__barrier_in_b) {
            puVar7 = stb__barrier_out_e + 1;
          }
          else {
            memcpy(stb__dout,pbVar10 + 1,(ulong)(uVar9 - 0x1f));
          }
        }
        pbVar8 = pbVar10 + ((ulong)*pbVar10 - 0x1e);
        stb__dout = puVar7;
      }
      else {
        stb__match(stb__dout + -(ulong)((uint)bVar1 * 0x100 + -0x3fff + (uint)pbVar10[1]),
                   pbVar10[2] + 1);
        pbVar8 = pbVar10 + 3;
      }
    } while ((pbVar8 != pbVar10) &&
            (pbVar10 = pbVar8, stb__dout <= puVar5 + CONCAT44((int)((ulong)puVar5 >> 0x20),uVar4)));
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    ImFontConfig::ImFontConfig(&local_148);
  }
  else {
    local_148.DstFont = font_cfg_template->DstFont;
    local_148.FontData = font_cfg_template->FontData;
    local_148.FontDataSize = font_cfg_template->FontDataSize;
    local_148.FontDataOwnedByAtlas = font_cfg_template->FontDataOwnedByAtlas;
    local_148._13_3_ = *(undefined3 *)&font_cfg_template->field_0xd;
    local_148.FontNo = font_cfg_template->FontNo;
    local_148.SizePixels = font_cfg_template->SizePixels;
    local_148.OversampleH = font_cfg_template->OversampleH;
    local_148.OversampleV = font_cfg_template->OversampleV;
    local_148.PixelSnapH = font_cfg_template->PixelSnapH;
    local_148._33_3_ = *(undefined3 *)&font_cfg_template->field_0x21;
    local_148.GlyphExtraSpacing.x = (font_cfg_template->GlyphExtraSpacing).x;
    local_148._40_8_ = *(undefined8 *)&(font_cfg_template->GlyphExtraSpacing).y;
    local_148._48_8_ = *(undefined8 *)&(font_cfg_template->GlyphOffset).y;
    local_148.GlyphRanges = font_cfg_template->GlyphRanges;
    local_148.GlyphMinAdvanceX = font_cfg_template->GlyphMinAdvanceX;
    local_148.GlyphMaxAdvanceX = font_cfg_template->GlyphMaxAdvanceX;
    local_148.MergeMode = font_cfg_template->MergeMode;
    local_148._73_3_ = *(undefined3 *)&font_cfg_template->field_0x49;
    local_148.RasterizerFlags = font_cfg_template->RasterizerFlags;
    local_148.RasterizerMultiply = font_cfg_template->RasterizerMultiply;
    local_148.EllipsisChar = font_cfg_template->EllipsisChar;
    local_148.Name[0] = font_cfg_template->Name[0];
    local_148.Name[1] = font_cfg_template->Name[1];
    local_148.Name._2_8_ = *(undefined8 *)(font_cfg_template->Name + 2);
    local_148.Name._10_8_ = *(undefined8 *)(font_cfg_template->Name + 10);
    local_148.Name._18_8_ = *(undefined8 *)(font_cfg_template->Name + 0x12);
    local_148.Name._26_8_ = *(undefined8 *)(font_cfg_template->Name + 0x1a);
    local_148._120_8_ = *(undefined8 *)(font_cfg_template->Name + 0x22);
  }
  local_148.FontDataOwnedByAtlas = true;
  local_b8.OversampleH = local_148.OversampleH;
  local_b8.OversampleV = local_148.OversampleV;
  local_b8.PixelSnapH = local_148.PixelSnapH;
  local_b8._33_3_ = local_148._33_3_;
  local_b8.GlyphExtraSpacing.x = local_148.GlyphExtraSpacing.x;
  local_b8.GlyphExtraSpacing.y = local_148.GlyphExtraSpacing.y;
  local_b8.GlyphOffset.x = local_148.GlyphOffset.x;
  local_b8.GlyphOffset.y = local_148.GlyphOffset.y;
  local_b8._52_4_ = local_148._52_4_;
  local_b8.GlyphRanges = local_148.GlyphRanges;
  local_b8.DstFont = local_148.DstFont;
  local_b8.GlyphMinAdvanceX = local_148.GlyphMinAdvanceX;
  local_b8.GlyphMaxAdvanceX = local_148.GlyphMaxAdvanceX;
  local_b8.MergeMode = local_148.MergeMode;
  local_b8._73_3_ = local_148._73_3_;
  local_b8.RasterizerFlags = local_148.RasterizerFlags;
  local_b8.RasterizerMultiply = local_148.RasterizerMultiply;
  local_b8.EllipsisChar = local_148.EllipsisChar;
  local_b8.Name[0] = local_148.Name[0];
  local_b8.Name[1] = local_148.Name[1];
  local_b8.Name[2] = local_148.Name[2];
  local_b8.Name[3] = local_148.Name[3];
  local_b8.Name[4] = local_148.Name[4];
  local_b8.Name[5] = local_148.Name[5];
  local_b8.Name[6] = local_148.Name[6];
  local_b8.Name[7] = local_148.Name[7];
  local_b8.Name[8] = local_148.Name[8];
  local_b8.Name[9] = local_148.Name[9];
  local_b8.Name[10] = local_148.Name[10];
  local_b8.Name[0xb] = local_148.Name[0xb];
  local_b8.Name[0xc] = local_148.Name[0xc];
  local_b8.Name[0xd] = local_148.Name[0xd];
  local_b8.Name[0xe] = local_148.Name[0xe];
  local_b8.Name[0xf] = local_148.Name[0xf];
  local_b8.Name[0x10] = local_148.Name[0x10];
  local_b8.Name[0x11] = local_148.Name[0x11];
  local_b8.Name[0x12] = local_148.Name[0x12];
  local_b8.Name[0x13] = local_148.Name[0x13];
  local_b8.Name[0x14] = local_148.Name[0x14];
  local_b8.Name[0x15] = local_148.Name[0x15];
  local_b8.Name[0x16] = local_148.Name[0x16];
  local_b8.Name[0x17] = local_148.Name[0x17];
  local_b8.Name[0x18] = local_148.Name[0x18];
  local_b8.Name[0x19] = local_148.Name[0x19];
  local_b8.Name[0x1a] = local_148.Name[0x1a];
  local_b8.Name[0x1b] = local_148.Name[0x1b];
  local_b8.Name[0x1c] = local_148.Name[0x1c];
  local_b8.Name[0x1d] = local_148.Name[0x1d];
  local_b8.Name[0x1e] = local_148.Name[0x1e];
  local_b8.Name[0x1f] = local_148.Name[0x1f];
  local_b8.Name[0x20] = local_148.Name[0x20];
  local_b8.Name[0x21] = local_148.Name[0x21];
  local_b8.Name[0x22] = local_148.Name[0x22];
  local_b8.Name[0x23] = local_148.Name[0x23];
  local_b8.Name[0x24] = local_148.Name[0x24];
  local_b8.Name[0x25] = local_148.Name[0x25];
  local_b8.Name[0x26] = local_148.Name[0x26];
  local_b8.Name[0x27] = local_148.Name[0x27];
  local_b8._126_2_ = local_148._126_2_;
  local_b8._12_4_ = local_148._12_4_;
  local_b8.FontDataSize = iVar12;
  local_b8.FontNo = local_148.FontNo;
  local_b8.SizePixels = size_pixels;
  if (glyph_ranges != (ImWchar *)0x0) {
    local_b8.GlyphRanges = glyph_ranges;
  }
  local_b8.FontData = puVar5;
  pIVar6 = AddFont(this,&local_b8);
  return pIVar6;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char *)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}